

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O3

void __thiscall
spdlog::details::registry::register_logger(registry *this,shared_ptr<spdlog::logger> *new_logger)

{
  int iVar1;
  shared_ptr<spdlog::logger> local_28;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    local_28.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_28.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    register_logger_(this,&local_28);
    if (local_28.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void registry::register_logger(std::shared_ptr<logger> new_logger) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    register_logger_(std::move(new_logger));
}